

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreFind.h
# Opt level: O0

BoyerMooreTextFindResult * __thiscall
axl::sl::
BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8Decoder,_false,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
::find(BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8Decoder,_false,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
       *this,BoyerMooreTextState *state,void *p0,size_t size,utf32_t replacementChar)

{
  bool bVar1;
  intptr_t iVar2;
  BoyerMooreTextAccessor *pBVar3;
  size_t sVar4;
  BoyerMooreTextState *this_00;
  char *in_RCX;
  BoyerMooreTextState *in_RDX;
  ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_> *in_RSI;
  BoyerMooreTextFindResult *in_RDI;
  Result RVar5;
  size_t binOffset;
  BoyerMooreTextAccessor accessor;
  size_t i;
  size_t fullLength;
  size_t dstLength;
  size_t srcLength;
  char *p2;
  Result convertResult;
  utf32_t buffer [256];
  DecoderState decoderState;
  char *end;
  PtrIterator<const_char,_false> p;
  BoyerMooreTextState *in_stack_fffffffffffffad8;
  BoyerMooreTextState *pBVar6;
  DecoderState in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae4;
  BoyerMooreTextState *in_stack_fffffffffffffaf8;
  utf32_t replacement;
  BoyerMooreTextState *in_stack_fffffffffffffb00;
  BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8Decoder,_false,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
  *in_stack_fffffffffffffb08;
  BoyerMooreTextAccessor *in_stack_fffffffffffffb10;
  BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8Decoder,_false,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
  *in_stack_fffffffffffffb18;
  DecoderState *in_stack_fffffffffffffb20;
  size_t in_stack_fffffffffffffb28;
  BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8Decoder,_false,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
  *this_01;
  undefined1 *charOffset;
  BoyerMooreTextFindResult *binSize;
  PtrIterator<const_char,_false> local_4a0;
  BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8Decoder,_false,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
  *local_498;
  char *in_stack_fffffffffffffb70;
  char *in_stack_fffffffffffffb78;
  BoyerMooreTextState *state_00;
  wchar_t *local_458;
  char *local_450;
  BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8Decoder,_false,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
  local_448 [14];
  undefined1 auStack_48 [4];
  DecoderState local_44;
  char *local_40;
  char *local_38;
  PtrIterator<const_char,_false> local_30 [4];
  BoyerMooreTextState *local_10;
  
  binSize = in_RDI;
  local_10 = in_RDX;
  PtrIterator<const_char,_false>::PtrIterator(local_30,in_RCX);
  local_40 = (char *)PtrIterator<const_char,_false>::operator+
                               ((PtrIterator<const_char,_false> *)in_stack_fffffffffffffad8,0x122a83
                               );
  local_38 = PtrIterator::operator_cast_to_char_((PtrIterator *)&local_40);
  local_44 = BoyerMooreTextState::getDecoderState(local_10);
  while( true ) {
    replacement = (utf32_t)((ulong)in_stack_fffffffffffffaf8 >> 0x20);
    bVar1 = PtrIterator<const_char,_false>::operator<(local_30,local_38);
    if (!bVar1) {
      BoyerMooreTextFindResult::BoyerMooreTextFindResult(in_RDI);
      return binSize;
    }
    this_01 = local_448;
    charOffset = auStack_48;
    PtrIterator::operator_cast_to_char_((PtrIterator *)local_30);
    RVar5 = enc::
            Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::enc::ToCaseFolded,_axl::enc::Utf8Decoder>
            ::convert(in_stack_fffffffffffffb20,(DstUnit *)in_stack_fffffffffffffb18,
                      (DstUnit *)in_stack_fffffffffffffb10,(SrcUnit *)in_stack_fffffffffffffb08,
                      (SrcUnit *)in_stack_fffffffffffffb00,replacement);
    local_450 = RVar5.m_src;
    iVar2 = PtrIterator<const_char,_false>::operator-
                      ((PtrIterator<const_char,_false> *)
                       CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                       (char *)in_stack_fffffffffffffad8);
    pBVar6 = (BoyerMooreTextState *)-iVar2;
    local_458 = RVar5.m_dst;
    pBVar3 = (BoyerMooreTextAccessor *)((long)local_458 - (long)local_448 >> 2);
    sVar4 = BoyerMooreStateBase<wchar_t>::getTailLength((BoyerMooreStateBase<wchar_t> *)0x122b9a);
    state_00 = (BoyerMooreTextState *)
               ((long)&(pBVar3->
                       super_BoyerMooreIncrementalAccessorBase<wchar_t,_false,_axl::sl::BoyerMooreTextState>
                       ).m_state + sVar4);
    BoyerMooreTextAccessor::BoyerMooreTextAccessor
              ((BoyerMooreTextAccessor *)
               CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
               in_stack_fffffffffffffad8,(utf32_t *)0x122bc7);
    this_00 = (BoyerMooreTextState *)
              BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8Decoder,_false,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
              ::findImpl<axl::sl::BoyerMooreTextAccessor>
                        (in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,
                         (size_t)in_stack_fffffffffffffb08,(size_t)in_stack_fffffffffffffb00);
    in_stack_fffffffffffffb00 = this_00;
    sVar4 = ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>::getCount(in_RSI);
    if ((BoyerMooreTextState *)
        ((long)&(this_00->super_BoyerMooreStateBase<wchar_t>).m_offset + sVar4) <= state_00) break;
    PtrIterator::operator_cast_to_char_((PtrIterator *)local_30);
    in_stack_fffffffffffffb18 =
         (BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8Decoder,_false,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
          *)locateBinOffset(state_00,(size_t)in_stack_fffffffffffffb00,in_stack_fffffffffffffb78,
                            in_stack_fffffffffffffb70);
    in_stack_fffffffffffffb08 = local_448;
    in_stack_fffffffffffffaf8 = local_10;
    local_498 = in_stack_fffffffffffffb18;
    PtrIterator::operator_cast_to_char_((PtrIterator *)local_30);
    in_stack_fffffffffffffae0 = local_44;
    BoyerMooreTextState::advance<false>
              (this_00,(size_t)charOffset,(utf32_t *)this_01,in_stack_fffffffffffffb28,
               (size_t)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,(size_t)binSize,
               (DecoderState)in_RSI);
    PtrIterator<const_char,_false>::PtrIterator(&local_4a0,local_450);
    in_stack_fffffffffffffad8 = pBVar6;
    in_stack_fffffffffffffb10 = pBVar3;
  }
  PtrIterator::operator_cast_to_char_((PtrIterator *)local_30);
  createFindResult(this_01,in_stack_fffffffffffffb00,(size_t)local_10,
                   (char *)in_stack_fffffffffffffb18,(char *)in_stack_fffffffffffffb10);
  return binSize;
}

Assistant:

BoyerMooreTextFindResult
	find(
		BoyerMooreTextState* state,
		const void* p0,
		size_t size,
		utf32_t replacementChar = enc::StdChar_Replacement
	) const {
		ASSERT(state->getPatternLength() == this->m_pattern.getCount());

		sl::PtrIterator<const char, IsReverse> p(IsReverse ? (char*)p0 + size - 1 : (char*)p0);
		const char* end = p + size;

		enc::DecoderState decoderState = state->getDecoderState();

		while (p < end) {
			utf32_t buffer[Details::DecoderBufferLength];

			typename Convert::Result convertResult = Convert::convert(
				&decoderState,
				buffer,
				buffer + countof(buffer),
				p,
				end,
				replacementChar
			);

			const char* p2 = convertResult.m_src; // just a short alias
			size_t srcLength = -(p - p2); // respect IsReverse
			size_t dstLength = convertResult.m_dst - buffer;
			size_t fullLength = state->getTailLength() + dstLength;
			size_t i;

			BoyerMooreTextAccessor accessor(state, buffer);

			if (IsWholeWord) {
				i = findWholeWordImpl(state, accessor, fullLength);
				if (i + this->m_pattern.getCount() < fullLength) // account for suffix
					return createFindResult(state, i, p, p2);

			} else {
				i = this->findImpl(accessor, 0, fullLength);
				if (i + this->m_pattern.getCount() <= fullLength)
					return createFindResult(state, i, p, p2);
			}

			// locate bin-offset of the prospective start of match
			size_t binOffset = locateBinOffset(state, i, p, p2);

			state->advance<IsReverse>(
				i,
				buffer,
				dstLength,
				binOffset,
				IsReverse ? p2 + 1 : (const char*)p,
				srcLength,
				decoderState
			);

 			ASSERT(state->getBinTailSize() >= state->getTailLength());
			p = p2;
		}

		return BoyerMooreTextFindResult();
	}